

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterYs<double>,_ImPlot::TransformerLogLin>::LineStripRenderer
          (LineStripRenderer<ImPlot::GetterYs<double>,_ImPlot::TransformerLogLin> *this,
          GetterYs<double> *getter,TransformerLogLin *transformer,ImU32 col,float weight)

{
  TransformerLogLin *this_00;
  ImVec2 IVar1;
  ImPlotPoint local_40;
  float local_28;
  ImU32 local_24;
  float weight_local;
  ImU32 col_local;
  TransformerLogLin *transformer_local;
  GetterYs<double> *getter_local;
  LineStripRenderer<ImPlot::GetterYs<double>,_ImPlot::TransformerLogLin> *this_local;
  
  this->Getter = getter;
  this->Transformer = transformer;
  this->Prims = this->Getter->Count + -1;
  this->Col = col;
  this->Weight = weight;
  local_28 = weight;
  local_24 = col;
  _weight_local = transformer;
  transformer_local = (TransformerLogLin *)getter;
  getter_local = (GetterYs<double> *)this;
  ImVec2::ImVec2(&this->P1);
  this_00 = this->Transformer;
  local_40 = GetterYs<double>::operator()(this->Getter,0);
  IVar1 = TransformerLogLin::operator()(this_00,&local_40);
  this->P1 = IVar1;
  return;
}

Assistant:

inline LineStripRenderer(const TGetter& getter, const TTransformer& transformer, ImU32 col, float weight) :
        Getter(getter),
        Transformer(transformer),
        Prims(Getter.Count - 1),
        Col(col),
        Weight(weight)
    {
        P1 = Transformer(Getter(0));
    }